

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringDatatypeValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::StringDatatypeValidator::checkAdditionalFacet
          (StringDatatypeValidator *this,XMLCh *content,MemoryManager *manager)

{
  bool bVar1;
  short sVar2;
  uint uVar3;
  InvalidDatatypeValueException *pIVar4;
  MemoryManager *manager_local;
  XMLCh *content_local;
  StringDatatypeValidator *this_local;
  
  uVar3 = DatatypeValidator::getFacetsDefined((DatatypeValidator *)this);
  if ((uVar3 & 0x4000) != 0) {
    sVar2 = DatatypeValidator::getWSFacet((DatatypeValidator *)this);
    if (sVar2 == 1) {
      bVar1 = XMLString::isWSReplaced(content);
      if (!bVar1) {
        pIVar4 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeValueException::InvalidDatatypeValueException
                  (pIVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/StringDatatypeValidator.cpp"
                   ,0xae,VALUE_WS_replaced,content,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar4,&InvalidDatatypeValueException::typeinfo,
                    InvalidDatatypeValueException::~InvalidDatatypeValueException);
      }
    }
    else {
      sVar2 = DatatypeValidator::getWSFacet((DatatypeValidator *)this);
      if ((sVar2 == 2) && (bVar1 = XMLString::isWSCollapsed(content), !bVar1)) {
        pIVar4 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeValueException::InvalidDatatypeValueException
                  (pIVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/StringDatatypeValidator.cpp"
                   ,0xb3,VALUE_WS_collapsed,content,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar4,&InvalidDatatypeValueException::typeinfo,
                    InvalidDatatypeValueException::~InvalidDatatypeValueException);
      }
    }
  }
  return;
}

Assistant:

void StringDatatypeValidator::checkAdditionalFacet(const XMLCh* const content
                                                   , MemoryManager* const manager) const
{
    //
    // check WhiteSpace
    //
    if ((getFacetsDefined() & DatatypeValidator::FACET_WHITESPACE) != 0 )
    {
        if ( getWSFacet() == DatatypeValidator::REPLACE )
        {
            if (!XMLString::isWSReplaced(content))
                ThrowXMLwithMemMgr1(InvalidDatatypeValueException, XMLExcepts::VALUE_WS_replaced, content, manager);
        }
        else if ( getWSFacet() == DatatypeValidator::COLLAPSE )
        {
            if (!XMLString::isWSCollapsed(content))
                ThrowXMLwithMemMgr1(InvalidDatatypeValueException, XMLExcepts::VALUE_WS_collapsed, content, manager);
        }

    }
}